

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int parse_all_expressions(SymbolTable *sym)

{
  TokenType TVar1;
  SymbolInfo SVar2;
  BOOL BVar3;
  int iVar4;
  HashErr HVar5;
  List *pLVar6;
  List *pLVar7;
  SymbolInfo val;
  SymbolInfo SVar8;
  int iVar9;
  char *name;
  List dummy;
  List def;
  SymbolInfo local_98;
  List *pLStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  anon_union_8_7_0ba269be_for_u aStack_80;
  char *local_78;
  unsigned_long uStack_70;
  Token local_50;
  
  BVar3 = fetch_next_token(&local_50);
  if (BVar3 == FALSE) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    do {
      while( true ) {
        if (local_50.type != TOK_LEFT_PAREN) {
          fatal_input_error("Expecting \'(\' but not finding one; aborting.\n");
        }
        pLVar6 = parse_expression();
        if (pLVar6 != (List *)0x0) break;
        input_error("stray \'(\' with no following expression!");
        BVar3 = fetch_next_token(&local_50);
        if (BVar3 == FALSE) {
          return iVar9;
        }
      }
      if (1 < (pLVar6->token).type - TOK_DEFINE) {
        local_98.n = 0;
        aStack_80 = (pLVar6->token).u;
        local_78 = (pLVar6->token).filename;
        uStack_70 = (pLVar6->token).lineno;
        _local_88 = CONCAT44((int)((ulong)*(undefined8 *)&pLVar6->token >> 0x20),0x4c);
        pLStack_90 = pLVar6;
        reduce((List *)&local_98,sym,0);
        pLVar6 = pLStack_90;
      }
      if (pLVar6 != (List *)0x0) {
        TVar1 = (pLVar6->token).type;
        if (TVar1 == TOK_DEFOPCODE) {
          iVar4 = parse_defopcode(sym,pLVar6->cdr);
          iVar9 = iVar4 + iVar9;
          if (preprocess_only != FALSE) {
            fputs("\n(",_stdout);
            print_list((FILE *)_stdout,pLVar6);
            puts(")");
          }
        }
        else if (TVar1 == TOK_DEFINE) {
          pLVar6 = pLVar6->cdr;
          TVar1 = (pLVar6->token).type;
          pLVar7 = pLVar6;
          if ((TVar1 - TOK_IDENTIFIER < 2) ||
             (((TVar1 == TOK_LIST && (pLVar7 = pLVar6->car, pLVar7 != (List *)0x0)) &&
              ((pLVar7->token).type == TOK_IDENTIFIER)))) {
            name = (pLVar7->token).u.string;
          }
          else {
            name = (char *)0x0;
          }
          if (name == (char *)0x0) {
            iVar4 = 0;
            parse_error(pLVar6,"Invalid macro name.  Ignoring...\n");
          }
          else {
            val.p = malloc(0x10);
            *(List **)val.p = pLVar6;
            *(undefined8 *)(val.n + 8) = 0;
            HVar5 = lookup_symbol(sym,name,&local_98,(char **)0x0);
            SVar2 = local_98;
            if (HVar5 == HASH_NOERR) {
              do {
                SVar8 = SVar2;
                SVar2 = (SymbolInfo)((SymbolInfo *)(SVar8.n + 8))->n;
              } while (SVar2.n != 0);
              ((SymbolInfo *)(SVar8.n + 8))->p = (void *)val;
            }
            else {
              local_98.p = val.p;
              insert_symbol(sym,name,val);
            }
            iVar4 = 1;
          }
          iVar9 = iVar4 + iVar9;
        }
      }
      BVar3 = fetch_next_token(&local_50);
    } while (BVar3 != FALSE);
  }
  return iVar9;
}

Assistant:

int
parse_all_expressions (SymbolTable *sym)
{
  List *new;
  int num_parsed = 0;
  List def;

  while (fetch_next_token (&def.token))
    {
      if (def.token.type != TOK_LEFT_PAREN)
	fatal_input_error ("Expecting '(' but not finding one; aborting.\n");

      /* Read in the expression just defined. */
      new = parse_expression ();
      if (new == NULL)
	{
	  input_error ("stray '(' with no following expression!");
	  continue;
	}

      if (new->token.type != TOK_DEFINE && new->token.type != TOK_DEFOPCODE)
	{
	  List dummy = { NULL, 0 /* new */, { /* new->token */0 } };
	  dummy.car = new;
	  dummy.token = new->token;
	  dummy.token.type = TOK_LIST;
	  reduce (&dummy, sym, 0);
	  new = dummy.car;
	}

      if (new != NULL)
	{
	  if (new->token.type == TOK_DEFINE)
	    num_parsed += parse_define (sym, new->cdr);
	  else if (new->token.type == TOK_DEFOPCODE)
	    {
	      num_parsed += parse_defopcode (sym, new->cdr);

	      if (preprocess_only)
		{
		  fputs ("\n(", stdout);
		  print_list (stdout, new);
		  puts (")");
		}
	    }
	}
    }

  return num_parsed;
}